

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_batch.c
# Opt level: O0

int write_lattice(ps_decoder_t *ps,char *latdir,char *uttid)

{
  int iVar1;
  ps_lattice_t *dag;
  ps_config_t *config_00;
  char *pcVar2;
  logmath_t *lmath_00;
  char *__s2;
  double p;
  int32 beam;
  char *outfile;
  cmd_ln_t *config;
  logmath_t *lmath;
  ps_lattice_t *lat;
  char *uttid_local;
  char *latdir_local;
  ps_decoder_t *ps_local;
  
  dag = ps_get_lattice(ps);
  if (dag == (ps_lattice_t *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
            ,0x1f9,"Failed to obtain word lattice for utterance %s\n",uttid);
    ps_local._4_4_ = -1;
  }
  else {
    config_00 = ps_get_config(ps);
    pcVar2 = ps_config_str(config_00,"outlatext");
    pcVar2 = string_join(latdir,"/",uttid,pcVar2,0);
    lmath_00 = ps_get_logmath(ps);
    p = ps_config_float(config_00,"outlatbeam");
    iVar1 = logmath_log(lmath_00,(float64)p);
    ps_lattice_posterior_prune(dag,iVar1);
    __s2 = ps_config_str(config_00,"outlatfmt");
    iVar1 = strcmp("htk",__s2);
    if (iVar1 == 0) {
      iVar1 = ps_lattice_write_htk(dag,pcVar2);
      if (iVar1 < 0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                ,0x205,"Failed to write lattice to %s\n",pcVar2);
        return -1;
      }
    }
    else {
      iVar1 = ps_lattice_write(dag,pcVar2);
      if (iVar1 < 0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                ,0x20b,"Failed to write lattice to %s\n",pcVar2);
        return -1;
      }
    }
    ps_local._4_4_ = 0;
  }
  return ps_local._4_4_;
}

Assistant:

static int
write_lattice(ps_decoder_t *ps, char const *latdir, char const *uttid)
{
    ps_lattice_t *lat;
    logmath_t *lmath;
    cmd_ln_t *config;
    char *outfile;
    int32 beam;

    if ((lat = ps_get_lattice(ps)) == NULL) {
        E_ERROR("Failed to obtain word lattice for utterance %s\n", uttid);
        return -1;
    }
    config = ps_get_config(ps);
    outfile = string_join(latdir, "/", uttid,
                          ps_config_str(config, "outlatext"), NULL);
    /* Prune lattice. */
    lmath = ps_get_logmath(ps);
    beam = logmath_log(lmath, ps_config_float(config, "outlatbeam"));
    ps_lattice_posterior_prune(lat, beam);
    if (0 == strcmp("htk", ps_config_str(config, "outlatfmt"))) {
        if (ps_lattice_write_htk(lat, outfile) < 0) {
            E_ERROR("Failed to write lattice to %s\n", outfile);
            return -1;
        }
    }
    else {
        if (ps_lattice_write(lat, outfile) < 0) {
            E_ERROR("Failed to write lattice to %s\n", outfile);
            return -1;
        }
    }
    return 0;
}